

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O0

int __thiscall tcu::abs(tcu *this,int __x)

{
  double this_00;
  bool bVar1;
  undefined4 in_register_00000034;
  Interval local_58;
  Interval local_40;
  undefined1 local_28 [8];
  Interval mono;
  Interval *x_local;
  
  mono.m_hi = (double)CONCAT44(in_register_00000034,__x);
  applyMonotone((Interval *)local_28,std::abs,(Interval *)mono.m_hi);
  this_00 = mono.m_hi;
  Interval::Interval(&local_40,0.0);
  bVar1 = Interval::contains((Interval *)this_00,&local_40);
  if (bVar1) {
    Interval::Interval(&local_58,0.0);
    Interval::Interval((Interval *)this,&local_58,(Interval *)local_28);
  }
  else {
    *(undefined1 (*) [8])this = local_28;
    *(undefined8 *)(this + 8) = mono._0_8_;
    *(double *)(this + 0x10) = mono.m_lo;
  }
  return (int)this;
}

Assistant:

Interval abs (const Interval& x)
{
	const Interval mono = applyMonotone(std::abs, x);

	if (x.contains(0.0))
		return Interval(0.0, mono);

	return mono;
}